

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# todec.h
# Opt level: O3

void cppcms::impl::todec<long_long>(longlong v,char *buf)

{
  char cVar1;
  char *begin;
  char *local_20;
  char *local_18;
  
  if (v == 0) {
    buf[0] = '0';
    buf[1] = '\0';
  }
  else {
    local_18 = (char *)0x0;
    local_20 = buf;
    details::decimal_traits<true>::conv<long_long>(v,&local_18,&local_20);
    *local_20 = '\0';
    for (; local_20 = local_20 + -1, local_18 < local_20; local_18 = local_18 + 1) {
      cVar1 = *local_18;
      *local_18 = *local_20;
      *local_20 = cVar1;
    }
  }
  return;
}

Assistant:

void todec(Integer v,char *buf)
		{
			typedef std::numeric_limits<Integer> limits;
			if(v == 0) {
				*buf++ = '0';
				*buf++ = 0;
				return;
			}
			char *begin=0;

			details::decimal_traits<limits::is_signed>::conv(v,begin,buf);
			
			*buf-- = 0;
			while(begin < buf) {
				char tmp = *begin;
				*begin = *buf;
				*buf = tmp;
				buf--;
				begin++;
			}
		}